

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_agents.c
# Opt level: O3

REF_STATUS ref_agents_population(REF_AGENTS ref_agents,char *context)

{
  int *piVar1;
  int iVar2;
  REF_MPI ref_mpi;
  REF_AGENT_STRUCT *pRVar3;
  uint uVar4;
  void *value;
  long lVar5;
  ulong uVar6;
  
  ref_mpi = ref_agents->ref_mpi;
  value = calloc(1,0x20);
  if (value == (void *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",0x62,
           "ref_agents_population","malloc counts of REF_INT NULL");
    uVar4 = 2;
  }
  else {
    iVar2 = ref_agents->max;
    if (0 < (long)iVar2) {
      pRVar3 = ref_agents->agent;
      lVar5 = 0;
      do {
        uVar6 = (ulong)*(uint *)((long)pRVar3->xyz + lVar5 + -0x30);
        if (7 < uVar6) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",
                 0x65,"ref_agents_population","last");
          return 1;
        }
        piVar1 = (int *)((long)value + uVar6 * 4);
        *piVar1 = *piVar1 + 1;
        lVar5 = lVar5 + 0x68;
      } while ((long)iVar2 * 0x68 - lVar5 != 0);
    }
    uVar4 = ref_mpi_allsum(ref_mpi,value,8,1);
    if (uVar4 == 0) {
      if (ref_mpi->id == 0) {
        uVar6 = 0;
        lVar5 = 1;
        do {
          uVar6 = (ulong)(uint)((int)uVar6 + *(int *)((long)value + lVar5 * 4));
          lVar5 = lVar5 + 1;
        } while (lVar5 != 8);
        printf(" %5d of",uVar6);
        uVar6 = 1;
        do {
          printf(" %d:%4d",uVar6 & 0xffffffff,(ulong)*(uint *)((long)value + uVar6 * 4));
          uVar6 = uVar6 + 1;
        } while (uVar6 != 8);
        printf(" %s\n",context);
      }
      free(value);
      uVar4 = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",0x68
             ,"ref_agents_population",(ulong)uVar4,"as");
    }
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_agents_population(REF_AGENTS ref_agents,
                                         const char *context) {
  REF_MPI ref_mpi = ref_agents->ref_mpi;
  REF_INT id, *counts;
  ref_malloc_init(counts, REF_AGENT_MODE_LAST, REF_INT, 0);
  for (id = 0; id < ref_agents->max; id++) {
    RAS(0 <= ref_agent_mode(ref_agents, id), "last");
    RAS(REF_AGENT_MODE_LAST > ref_agent_mode(ref_agents, id), "last");
    counts[ref_agent_mode(ref_agents, id)]++;
  }
  RSS(ref_mpi_allsum(ref_mpi, counts, REF_AGENT_MODE_LAST, REF_INT_TYPE), "as");
  if (ref_mpi_once(ref_mpi)) {
    REF_INT total = 0;
    for (id = 1; id < REF_AGENT_MODE_LAST; id++) total += counts[id];
    printf(" %5d of", total);
    for (id = 1; id < REF_AGENT_MODE_LAST; id++)
      printf(" %d:%4d", id, counts[id]);
    printf(" %s\n", context);
  }
  ref_free(counts);
  return REF_SUCCESS;
}